

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall ritobin::io::impl_binary_read::BinBinaryReader::read_entries(BinBinaryReader *this)

{
  uint uVar1;
  uint *puVar2;
  BinBinaryReader *this_00;
  bool bVar3;
  uint *pos;
  pointer puVar4;
  char *pcVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> entryNameHashes;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  BinBinaryReader *local_1e8;
  pointer local_1e0;
  undefined1 local_1d8 [8];
  _Alloc_hider _Stack_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c0;
  undefined2 local_1b0 [4];
  vector<ritobin::Pair,_std::allocator<ritobin::Pair>_> local_1a8;
  Embed local_190;
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_150;
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_108;
  Pair local_c0;
  
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (uint *)(this->reader).cur_;
  pos = puVar2 + 1;
  if ((this->reader).cap_ < pos) {
    pcVar5 = "reader.read(entryCount)";
    pos = puVar2;
  }
  else {
    uVar1 = *puVar2;
    (this->reader).cur_ = (char *)pos;
    bVar3 = BinaryReader::read<unsigned_int>
                      (&this->reader,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,
                       (ulong)uVar1);
    if (bVar3) {
      local_1b0[0] = 0x8311;
      local_1a8.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e0 = local_208._M_impl.super__Vector_impl_data._M_finish;
      local_1e8 = this;
      for (puVar4 = local_208._M_impl.super__Vector_impl_data._M_start; this_00 = local_1e8,
          puVar4 != local_1e0; puVar4 = puVar4 + 1) {
        local_190.name.hash_ = *puVar4;
        local_1d8 = (undefined1  [8])0x0;
        local_1c8 = 0;
        aStack_1c0._8_8_ = 0;
        local_190.name.str_._M_dataplus._M_p = (pointer)&local_190.name.str_.field_2;
        local_190.name.str_._M_string_length = 0;
        _Stack_1d0._M_p = (pointer)&aStack_1c0;
        aStack_1c0._M_allocated_capacity = 0;
        local_190.name.str_.field_2._M_local_buf[0] = '\0';
        local_190.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_190.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_190.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar5 = (local_1e8->reader).cur_;
        bVar3 = read_entry(local_1e8,(Hash *)local_1d8,&local_190);
        if (!bVar3) {
          bVar3 = fail_msg(this_00,"read_entry(entryKeyHash, entry)",pcVar5);
          Embed::~Embed(&local_190);
          std::__cxx11::string::~string((string *)&_Stack_1d0);
          goto LAB_0010bd50;
        }
        std::
        variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
        ::variant<ritobin::Hash,void,void,ritobin::Hash,void>
                  ((variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
                    *)&local_108,(Hash *)local_1d8);
        std::
        variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
        ::variant<ritobin::Embed,void,void,ritobin::Embed,void>
                  ((variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
                    *)&local_150,&local_190);
        Pair::Pair(&local_c0,(Value *)&local_108,(Value *)&local_150);
        std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::emplace_back<ritobin::Pair>
                  (&local_1a8,&local_c0);
        Pair::~Pair(&local_c0);
        std::__detail::__variant::
        _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
        ::~_Variant_storage(&local_150);
        std::__detail::__variant::
        _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
        ::~_Variant_storage(&local_108);
        Embed::~Embed(&local_190);
        std::__cxx11::string::~string((string *)&_Stack_1d0);
      }
      bVar3 = true;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<char_const(&)[8],ritobin::Map>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_1e8->bin,"entries",local_1b0);
LAB_0010bd50:
      std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::~vector(&local_1a8);
      goto LAB_0010bd5a;
    }
    pcVar5 = "reader.read(entryNameHashes, entryCount)";
  }
  bVar3 = fail_msg(this,pcVar5,(char *)pos);
LAB_0010bd5a:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_208);
  return bVar3;
}

Assistant:

bool read_entries() noexcept {
            uint32_t entryCount = 0;
            std::vector<uint32_t> entryNameHashes;
            bin_assert(reader.read(entryCount));
            bin_assert(reader.read(entryNameHashes, entryCount));
            Map entriesMap = { Type::HASH,  Type::EMBED, {} };
            for (uint32_t entryNameHash : entryNameHashes) {
                Hash entryKeyHash = {};
                Embed entry = { { entryNameHash }, {} };
                bin_assert(read_entry(entryKeyHash, entry));
                entriesMap.items.emplace_back(Pair{ std::move(entryKeyHash), std::move(entry) });
            }
            bin.sections.emplace("entries", std::move(entriesMap));
            return true;
        }